

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PrefixUnaryExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PrefixUnaryExpressionSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,ExpressionSyntax *args_3)

{
  size_t sVar1;
  pointer ppAVar2;
  Info *pIVar3;
  SyntaxNode *pSVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  PrefixUnaryExpressionSyntax *pPVar10;
  long lVar11;
  
  pPVar10 = (PrefixUnaryExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PrefixUnaryExpressionSyntax *)this->endPtr < pPVar10 + 1) {
    pPVar10 = (PrefixUnaryExpressionSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pPVar10 + 1);
  }
  TVar5 = args_1->kind;
  uVar6 = args_1->field_0x2;
  NVar7.raw = (args_1->numFlags).raw;
  uVar8 = args_1->rawLen;
  pIVar3 = args_1->info;
  (pPVar10->super_ExpressionSyntax).super_SyntaxNode.kind = *args;
  (pPVar10->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pPVar10->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pPVar10->operatorToken).kind = TVar5;
  (pPVar10->operatorToken).field_0x2 = uVar6;
  (pPVar10->operatorToken).numFlags = (NumericTokenFlags)NVar7.raw;
  (pPVar10->operatorToken).rawLen = uVar8;
  (pPVar10->operatorToken).info = pIVar3;
  uVar9 = *(undefined4 *)&(args_2->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (args_2->super_SyntaxListBase).super_SyntaxNode.parent;
  (pPVar10->attributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_2->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar10->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar9;
  (pPVar10->attributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (pPVar10->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_2->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pPVar10->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (pPVar10->attributes).super_SyntaxListBase.childCount = (args_2->super_SyntaxListBase).childCount;
  sVar1 = (args_2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pPVar10->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
  ._M_ptr = (args_2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            _M_ptr;
  (pPVar10->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
  ._M_extent._M_extent_value = sVar1;
  (pPVar10->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006a4d30;
  (pPVar10->operand).ptr = args_3;
  (pPVar10->attributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pPVar10;
  sVar1 = (pPVar10->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (pPVar10->attributes).
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar11 = 0;
    do {
      *(PrefixUnaryExpressionSyntax **)(*(long *)((long)ppAVar2 + lVar11) + 8) = pPVar10;
      lVar11 = lVar11 + 8;
    } while (sVar1 << 3 != lVar11);
  }
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pPVar10;
  return pPVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }